

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

DiffuseAreaLight *
pbrt::DiffuseAreaLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc,ShapeHandle shape)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  float fVar2;
  short sVar3;
  Allocator AVar4;
  uintptr_t iptr;
  undefined4 extraout_var;
  size_t *psVar5;
  int c;
  int iVar6;
  float *pfVar7;
  Curve *this;
  long lVar8;
  long *plVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  ulong uVar11;
  Float FVar12;
  Float FVar13;
  undefined1 extraout_var_00 [60];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  bool twoSided;
  Float scale;
  FileLoc *local_3b0;
  Allocator alloc_local;
  SpectrumHandle L;
  float local_390;
  RGBColorSpace *imageColorSpace;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined8 local_370;
  undefined8 local_368;
  string filename;
  Image image;
  ImageChannelDesc channelDesc_1;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_278;
  undefined1 local_270 [8];
  long *local_268 [2];
  long local_258;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_250;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_230;
  ImageAndMetadata im;
  SpectrumHandle local_78;
  ColorEncodingHandle local_70;
  undefined8 local_68;
  ImageChannelDesc channelDesc;
  
  pvVar10 = &im.image.channelNames;
  alloc_local = alloc;
  local_370 = renderFromLight;
  local_368 = medium;
  im.image._0_8_ = pvVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"L","");
  local_68 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&L,(string *)parameters,(SpectrumHandle *)&im,
             (SpectrumType)&local_68,(Allocator)0x2);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar10) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  im.image._0_8_ = pvVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"scale","");
  scale = ParameterDictionary::GetOneFloat(parameters,(string *)&im,1.0);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar10) {
    local_3b0 = (FileLoc *)CONCAT44(local_3b0._4_4_,scale);
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
    scale = SUB84(local_3b0,0);
  }
  im.image._0_8_ = pvVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"twosided","");
  twoSided = ParameterDictionary::GetOneBool(parameters,(string *)&im,false);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar10) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  local_3b0 = loc;
  image._0_8_ = &image.channelNames;
  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
  paVar1 = &channelDesc_1.offset.field_2;
  channelDesc_1.offset.alloc.memoryResource = (memory_resource *)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1,"");
  ParameterDictionary::GetOneString
            ((string *)&im,parameters,(string *)&image,(string *)&channelDesc_1);
  ResolveFilename(&filename,(string *)&im);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar10) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
       *)channelDesc_1.offset.alloc.memoryResource != paVar1) {
    operator_delete(channelDesc_1.offset.alloc.memoryResource,channelDesc_1.offset.field_2._0_8_ + 1
                   );
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)image._0_8_ != &image.channelNames) {
    operator_delete((void *)image._0_8_,
                    (ulong)((long)&(image.channelNames.alloc.memoryResource)->_vptr_memory_resource
                           + 1));
  }
  AVar4.memoryResource = alloc_local.memoryResource;
  image.format = U256;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  image.channelNames.alloc.memoryResource = pstd::pmr::new_delete_resource();
  image.channelNames.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  image.channelNames.nAlloc = 0;
  image.channelNames.nStored = 0;
  image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  image.p8.alloc.memoryResource = AVar4.memoryResource;
  image.p8._8_16_ = ZEXT416(0) << 0x40;
  image.p8.nStored = 0;
  image.p16.alloc.memoryResource = AVar4.memoryResource;
  image.p16.nStored = 0;
  image.p32.alloc.memoryResource = AVar4.memoryResource;
  image.p32.nStored = 0;
  imageColorSpace = (RGBColorSpace *)0x0;
  image.p16._8_16_ = image.p8._8_16_;
  image.p32._8_16_ = image.p8._8_16_;
  if (filename._M_string_length == 0) {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      L.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&colorSpace->illuminant | 0x2000000000000);
    }
  }
  else {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits != 0) {
      ErrorExit(local_3b0,"Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
    }
    local_70.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read(&im,&filename,alloc_local,&local_70);
    channelDesc_1.offset.alloc.memoryResource = (memory_resource *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1,"R","");
    channelDesc_1.offset.nAlloc = (size_t)&local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1.offset.nAlloc,"G","");
    plVar9 = &local_258;
    local_268[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelDesc_1;
    Image::GetChannelDesc(&channelDesc,&im.image,requestedChannels);
    lVar8 = -0x60;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if (channelDesc.offset.nStored == 0) {
      ErrorExit<std::__cxx11::string&>
                (local_3b0,
                 "%s: Image provided to \"diffuse\" area light must have R, G, and B channels.",
                 &filename);
    }
    Image::SelectChannels((Image *)&channelDesc_1,&im.image,&channelDesc,alloc_local);
    paVar1 = &channelDesc_1.offset.field_2;
    image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)channelDesc_1.offset.ptr;
    image.format = (PixelFormat)channelDesc_1.offset.alloc.memoryResource;
    image.resolution.super_Tuple2<pbrt::Point2,_int>.x =
         (int)((ulong)channelDesc_1.offset.alloc.memoryResource >> 0x20);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)paVar1);
    image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_278.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_270)
    ;
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&image.p16,&local_250);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&image.p32,&local_230);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_230);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_250);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_270)
    ;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)paVar1);
    imageColorSpace = ImageMetadata::GetColorSpace(&im.metadata);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc.offset);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&im.metadata.stringVectors._M_t);
    if (im.metadata.colorSpace.set == true) {
      im.metadata.colorSpace.set = false;
    }
    if (im.metadata.MSE.set == true) {
      im.metadata.MSE.set = false;
    }
    if (im.metadata.samplesPerPixel.set == true) {
      im.metadata.samplesPerPixel.set = false;
    }
    if (im.metadata.fullResolution.set == true) {
      im.metadata.fullResolution.set = false;
    }
    if (im.metadata.pixelBounds.set == true) {
      im.metadata.pixelBounds.set = false;
    }
    if (im.metadata.NDCFromWorld.set == true) {
      im.metadata.NDCFromWorld.set = false;
    }
    if (im.metadata.cameraFromWorld.set == true) {
      im.metadata.cameraFromWorld.set = false;
    }
    if (im.metadata.renderTimeSeconds.set == true) {
      im.metadata.renderTimeSeconds.set = false;
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&im.image.p32);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&im.image.p16);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&im.image.p8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&im.image.channelNames);
  }
  pvVar10 = &im.image.channelNames;
  local_78.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )((ulong)&colorSpace->illuminant | 0x2000000000000);
  if (((ulong)L.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              .bits & 0xffffffffffff) != 0) {
    local_78.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = L.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits;
  }
  FVar12 = SpectrumToPhotometric(&local_78);
  scale = scale / FVar12;
  im.image._0_8_ = pvVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"power","");
  FVar12 = ParameterDictionary::GetOneFloat(parameters,(string *)&im,-1.0);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar10) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if (0.0 < FVar12) {
    local_374 = (imageColorSpace->XYZFromRGB).m[1][0];
    local_378 = (imageColorSpace->XYZFromRGB).m[1][1];
    local_37c = (imageColorSpace->XYZFromRGB).m[1][2];
    im.image._0_8_ = pvVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im,"R","");
    im.image.channelNames.nAlloc = (size_t)&im.image.encoding;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im.image.channelNames.nAlloc,"G","");
    psVar5 = &im.image.p8.nStored;
    im.image.p8.ptr = (uchar *)psVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im.image.p8.ptr,"B","");
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im;
    Image::GetChannelDesc(&channelDesc_1,&image,requestedChannels_00);
    lVar8 = -0x60;
    do {
      if (psVar5 != (size_t *)psVar5[-2]) {
        operator_delete((long *)psVar5[-2],*psVar5 + 1);
      }
      psVar5 = psVar5 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if ((0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
       (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
      auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
      fVar14 = 0.0;
      if (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
        lVar8 = 0;
        do {
          if (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
            uVar11 = 0;
            do {
              iVar6 = 0;
              do {
                local_3b0 = (FileLoc *)CONCAT44(local_3b0._4_4_,auVar16._0_4_);
                auVar16._0_4_ =
                     Image::GetChannel(&image,(Point2i)(lVar8 << 0x20 | uVar11),iVar6,
                                       (WrapMode2D)0x200000002);
                auVar16._4_60_ = extraout_var_00;
                auVar15 = ZEXT416((uint)local_374);
                if ((iVar6 != 0) && (auVar15 = ZEXT416((uint)local_378), iVar6 != 1)) {
                  auVar15 = ZEXT416((uint)local_37c);
                }
                auVar15 = vfmadd213ss_fma(auVar15,auVar16._0_16_,ZEXT416((uint)local_3b0));
                auVar16 = ZEXT1664(auVar15);
                iVar6 = iVar6 + 1;
              } while (iVar6 != 3);
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < (long)image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          }
          fVar14 = auVar16._0_4_;
          lVar8 = lVar8 + 1;
        } while (lVar8 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
      }
      local_390 = fVar14 / (float)(image.resolution.super_Tuple2<pbrt::Point2,_int>.x *
                                  image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
    }
    local_3b0 = (FileLoc *)CONCAT44(local_3b0._4_4_,(uint)twoSided);
    uVar11 = *(ulong *)shape.
                       super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                       .bits;
    sVar3 = (short)(uVar11 >> 0x30);
    if (uVar11 >> 0x32 == 0) {
      if (uVar11 < 0x2000000000000) {
        pfVar7 = (float *)(uVar11 & 0xffffffffffff);
        FVar13 = pfVar7[5] * *pfVar7 * (pfVar7[2] - pfVar7[1]);
      }
      else {
        uVar11 = uVar11 & 0xffffffffffff;
        if (sVar3 == 2) {
          FVar13 = (*(float *)(uVar11 + 0x1c) - *(float *)(uVar11 + 0x18)) *
                   *(float *)(uVar11 + 0x14) * *(float *)(uVar11 + 0x20);
        }
        else {
          fVar14 = (float)*(undefined8 *)(uVar11 + 0x18);
          fVar2 = (float)((ulong)*(undefined8 *)(uVar11 + 0x18) >> 0x20);
          auVar15._0_4_ = fVar14 * fVar14;
          auVar15._4_4_ = fVar2 * fVar2;
          auVar15._8_8_ = 0;
          auVar15 = vhsubps_avx(auVar15,auVar15);
          FVar13 = *(float *)(uVar11 + 0x20) * 0.5 * auVar15._0_4_;
        }
      }
    }
    else {
      this = (Curve *)(uVar11 & 0xffffffffffff);
      if (uVar11 >> 0x30 == 5) {
        FVar13 = this->uMin;
      }
      else if (sVar3 == 4) {
        FVar13 = Triangle::Area((Triangle *)this);
      }
      else {
        FVar13 = Curve::Area(this);
      }
    }
    scale = (FVar12 / ((float)((uint)((byte)local_3b0 & 1) * 0x40000000 +
                              (uint)!(bool)((byte)local_3b0 & 1) * 0x3f800000) * FVar13 * 3.1415927
                      * local_390)) * scale;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc_1.offset);
  }
  iVar6 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                    (alloc_local.memoryResource,0x178,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&alloc_local,(DiffuseAreaLight *)CONCAT44(extraout_var,iVar6),(Transform *)local_370,
             (MediumHandle *)local_368,&L,&scale,
             (ShapeHandle *)
             shape.
             super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
             .bits,&image,&imageColorSpace,&twoSided,&alloc_local);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&image.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&image.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&image.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&image.channelNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return (DiffuseAreaLight *)CONCAT44(extraout_var,iVar6);
}

Assistant:

DiffuseAreaLight *DiffuseAreaLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc,
                                           const ShapeHandle shape) {
    SpectrumHandle L =
        parameters.GetOneSpectrum("L", nullptr, SpectrumType::Illuminant, alloc);
    Float scale = parameters.GetOneFloat("scale", 1);
    bool twoSided = parameters.GetOneBool("twosided", false);

    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;
    if (!filename.empty()) {
        if (L != nullptr)
            ErrorExit(loc, "Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
        ImageAndMetadata im = Image::Read(filename, alloc);

        ImageChannelDesc channelDesc = im.image.GetChannelDesc({"R", "G", "B"});
        if (!channelDesc)
            ErrorExit(loc,
                      "%s: Image provided to \"diffuse\" area light must have "
                      "R, G, and B channels.",
                      filename);
        image = im.image.SelectChannels(channelDesc, alloc);

        imageColorSpace = im.metadata.GetColorSpace();
    } else if (L == nullptr)
        L = &colorSpace->illuminant;

    // scale so that radiance is equivalent to 1 nit
    scale /= SpectrumToPhotometric(L ? L : &colorSpace->illuminant);

    Float phi_v = parameters.GetOneFloat("power", -1.0f);
    if (phi_v > 0) {
        // k_e is the emissive power of the light as defined by the spectral
        // distribution and texture and is used to normalize the emitted
        // radiance such that the user-defined power will be the actual power
        // emitted by the light.
        Float k_e;
        // Get the appropriate luminance vector from the image colour space
        RGB lum = imageColorSpace->LuminanceVector();
        // we need to know which channels correspond to R, G and B
        // we know that the channelDesc is valid as we would have exited in the
        // block above otherwise
        ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
        if (image) {
            k_e = 0;
            // Assume no distortion in the mapping, FWIW...
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x) {
                    for (int c = 0; c < 3; ++c)
                        k_e += image.GetChannel({x, y}, c) * lum[c];
                }
            k_e /= image.Resolution().x * image.Resolution().y;
        }

        k_e *= (twoSided ? 2 : 1) * shape.Area() * Pi;

        // now multiply up scale to hit the target power
        scale *= phi_v / k_e;
    }

    return alloc.new_object<DiffuseAreaLight>(renderFromLight, medium, L, scale, shape,
                                              std::move(image), imageColorSpace, twoSided,
                                              alloc);
}